

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeMatrixDebugType(Builder *this,Id vectorType,int vectorCount,bool columnMajor)

{
  key_type kVar1;
  Id IVar2;
  Id IVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *pIVar7;
  mapped_type_conflict *pmVar8;
  value_type local_48;
  key_type local_40 [4];
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  uint local_20;
  Id IStack_1c;
  bool columnMajor_local;
  int vectorCount_local;
  Id vectorType_local;
  Builder *this_local;
  
  local_40[3] = 0;
  type._7_1_ = columnMajor;
  local_20 = vectorCount;
  IStack_1c = vectorType;
  _vectorCount_local = this;
  do {
    kVar1 = local_40[3];
    local_40[2] = 0x6c;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_40 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      pIVar7 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      IVar3 = makeVoidType(this);
      spv::Instruction::Instruction(pIVar7,IVar2,IVar3,OpExtInst);
      pIStack_30 = pIVar7;
      spv::Instruction::reserveOperands(pIVar7,5);
      spv::Instruction::addIdOperand(pIStack_30,this->nonSemanticShaderDebugInfo);
      spv::Instruction::addImmediateOperand(pIStack_30,0x6c);
      pIVar7 = pIStack_30;
      pmVar8 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&stack0xffffffffffffffe4);
      spv::Instruction::addIdOperand(pIVar7,*pmVar8);
      pIVar7 = pIStack_30;
      IVar2 = makeUintConstant(this,local_20,false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      pIVar7 = pIStack_30;
      IVar2 = makeBoolConstant(this,(bool)(type._7_1_ & 1),false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      local_40[0] = 0x6c;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedDebugTypes,local_40);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
                 pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_48);
      Module::mapInstruction(&this->module,pIStack_30);
      IVar2 = spv::Instruction::getResultId(pIStack_30);
      return IVar2;
    }
    local_40[1] = 0x6c;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_40 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_40[3]);
    pIStack_30 = *ppIVar6;
    IVar2 = spv::Instruction::getIdOperand(pIStack_30,0);
    if (IVar2 == IStack_1c) {
      IVar2 = spv::Instruction::getIdOperand(pIStack_30,1);
      IVar3 = makeUintConstant(this,local_20,false);
      if (IVar2 == IVar3) {
        IVar2 = spv::Instruction::getResultId(pIStack_30);
        return IVar2;
      }
    }
    local_40[3] = local_40[3] + 1;
  } while( true );
}

Assistant:

Id Builder::makeMatrixDebugType(Id const vectorType, int const vectorCount, bool columnMajor)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix][t];
        if (type->getIdOperand(0) == vectorType &&
            type->getIdOperand(1) == makeUintConstant(vectorCount))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeMatrix);
    type->addIdOperand(debugId[vectorType]); // vector type id
    type->addIdOperand(makeUintConstant(vectorCount)); // component count id
    type->addIdOperand(makeBoolConstant(columnMajor)); // column-major id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}